

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

TObjectReflection * __thiscall glslang::TProgram::getUniformBlock(TProgram *this,int index)

{
  TObjectReflection *pTVar1;
  
  pTVar1 = TReflection::getUniformBlock(this->reflection,index);
  return pTVar1;
}

Assistant:

const TObjectReflection& TProgram::getUniformBlock(int index) const   { return reflection->getUniformBlock(index); }